

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_bbox.cpp
# Opt level: O1

void __thiscall FBoundingBox::AddToBox(FBoundingBox *this,DVector2 *pos)

{
  double dVar1;
  
  if (pos->X < this->m_Box[2]) {
    this->m_Box[2] = pos->X;
  }
  dVar1 = pos->X;
  if (this->m_Box[3] <= dVar1 && dVar1 != this->m_Box[3]) {
    this->m_Box[3] = dVar1;
  }
  if (pos->Y < this->m_Box[1]) {
    this->m_Box[1] = pos->Y;
  }
  dVar1 = pos->Y;
  if (this->m_Box[0] <= dVar1 && dVar1 != this->m_Box[0]) {
    this->m_Box[0] = dVar1;
  }
  return;
}

Assistant:

void FBoundingBox::AddToBox (const DVector2 &pos)
{
	if (pos.X < m_Box[BOXLEFT])
		m_Box[BOXLEFT] = pos.X;
	if (pos.X > m_Box[BOXRIGHT])
		m_Box[BOXRIGHT] = pos.X;

	if (pos.Y < m_Box[BOXBOTTOM])
		m_Box[BOXBOTTOM] = pos.Y;
	if (pos.Y > m_Box[BOXTOP])
		m_Box[BOXTOP] = pos.Y;
}